

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalPdu.cpp
# Opt level: O3

int __thiscall DIS::SignalPdu::getMarshalledSize(SignalPdu *this)

{
  int iVar1;
  
  iVar1 = RadioCommunicationsFamilyPdu::getMarshalledSize(&this->super_RadioCommunicationsFamilyPdu)
  ;
  return iVar1 + (*(int *)&(this->_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                 *(int *)&(this->_data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start) + 0xc;
}

Assistant:

int SignalPdu::getMarshalledSize() const
{
  auto marshalSize = 0;

  marshalSize = RadioCommunicationsFamilyPdu::getMarshalledSize();
  marshalSize += 2; // _encodingScheme
  marshalSize += 2; // _tdlType
  marshalSize += 4; // _sampleRate
  marshalSize += 2; // _dataLength
  marshalSize += 2; // _samples
  marshalSize += _data.size();

  return marshalSize;
}